

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form2_Split(SplitForm2 Split)

{
  uint8_t uVar1;
  bool bVar2;
  pair<unsigned_int,_unsigned_int> pVar3;
  pointer puVar4;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  output;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_char,_std::allocator<unsigned_char>_> inputIntensity;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outputIntensity;
  Image input;
  
  Unit_Test::intensityArray(&inputIntensity,3);
  uVar1 = *inputIntensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&size,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&input,uVar1,(Image *)&size);
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&size);
  Unit_Test::fillImage(&input,0,0,input._width,input._height,&inputIntensity);
  Unit_Test::intensityArray(&outputIntensity,3);
  output.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (outputIntensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      outputIntensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar4 = outputIntensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar1 = *puVar4;
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                ((ImageTemplate<unsigned_char> *)&roiX,0,0,'\x01','\x01');
      Test_Helper::uniformImage((Image *)&size,uVar1,0,0,(ImageTemplate<unsigned_char> *)&roiX);
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
      ::emplace_back<PenguinV_Image::ImageTemplate<unsigned_char>>
                ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
                  *)&output,(Image *)&size);
      size.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00215948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((Image *)&size);
      roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00215948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&roiX);
      puVar4 = puVar4 + 1;
    } while (puVar4 != outputIntensity.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       size.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 4;
  (size.
   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->first = 0;
  (size.
   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->second = 0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].first = 0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].second = 0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].first = 0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].second = 0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].first = 0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].second = 0;
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       size.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pVar3 = Unit_Test::imageSize(&input);
  *size.
   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
   ._M_impl.super__Vector_impl_data._M_start = pVar3;
  pVar3 = Unit_Test::imageSize
                    (output.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = pVar3;
  pVar3 = Unit_Test::imageSize
                    (output.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2] = pVar3;
  pVar3 = Unit_Test::imageSize
                    (output.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2);
  size.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3] = pVar3;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi(&size,&roiX,&roiY,&roiWidth,&roiHeight);
  (*Split)(&input,*roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
           *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start,
           output.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start,
           roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[1],
           roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[1],
           output.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1,
           roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[2],
           roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[2],
           output.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2,
           roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[3],
           roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[3],roiWidth,roiHeight);
  bVar2 = Unit_Test::verifyImage
                    (output.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[1],
                     roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[1],roiWidth,roiHeight,
                     *inputIntensity.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  if (bVar2) {
    bVar2 = Unit_Test::verifyImage
                      (output.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,
                       roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[2],
                       roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[2],roiWidth,roiHeight,
                       inputIntensity.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[1]);
    if (bVar2) {
      bVar2 = Unit_Test::verifyImage
                        (output.
                         super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2,
                         roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[3],
                         roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[3],roiWidth,roiHeight,
                         inputIntensity.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[2]);
      goto LAB_001579c2;
    }
  }
  bVar2 = false;
LAB_001579c2:
  if (roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (size.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(size.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&output);
  if (outputIntensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(outputIntensity.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  input._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&input);
  if (inputIntensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(inputIntensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool form2_Split(SplitForm2 Split)
    {
        const std::vector < uint8_t > inputIntensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( inputIntensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), inputIntensity );

        const std::vector < uint8_t > outputIntensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > output;

        std::for_each( outputIntensity.begin(), outputIntensity.end(), [&]( uint8_t value )
        { output.push_back( uniformImage( value ) ); } );

        std::vector < std::pair <uint32_t, uint32_t> > size( 4 );

        size[0] = imageSize( input );
        size[1] = imageSize( output[0] );
        size[2] = imageSize( output[1] );
        size[3] = imageSize( output[2] );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        Split( input, roiX[0], roiY[0], output[0], roiX[1], roiY[1], output[1], roiX[2], roiY[2], output[2], roiX[3], roiY[3], roiWidth, roiHeight );

        return verifyImage( output[0], roiX[1], roiY[1], roiWidth, roiHeight, inputIntensity[0] ) &&
               verifyImage( output[1], roiX[2], roiY[2], roiWidth, roiHeight, inputIntensity[1] ) &&
               verifyImage( output[2], roiX[3], roiY[3], roiWidth, roiHeight, inputIntensity[2] );
    }